

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int *piVar1;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar2;
  byte bVar3;
  ushort uVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  uint32_t uVar10;
  CppStringType CVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint8_t *puVar15;
  MapFieldBase *this;
  RepeatedField<double> *rhs;
  uint64_t uVar16;
  long lVar17;
  EnumValueDescriptor *pEVar18;
  MessageLite *pMVar19;
  string *psVar20;
  ulong uVar21;
  RepeatedField<int> *pRVar22;
  RepeatedField<unsigned_int> *pRVar23;
  RepeatedField<long> *pRVar24;
  size_t sVar25;
  RepeatedField<float> *rhs_00;
  RepeatedField<unsigned_long> *pRVar26;
  RepeatedField<bool> *rhs_01;
  int *piVar27;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar28;
  ulong uVar29;
  Nonnull<const_char_*> pcVar30;
  byte *pbVar31;
  Nonnull<const_char_*> extraout_RAX;
  bool bVar32;
  uint uVar33;
  Reflection *this_00;
  ulong uVar34;
  char *in_R9;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> key;
  LogMessageData *pLVar35;
  float fVar36;
  double dVar37;
  Metadata MVar38;
  string_view s;
  string_view s_00;
  string_view field_name;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapValueConstRef map_value;
  undefined1 local_d8 [32];
  MapKey local_b8;
  MapValueConstRef local_a0;
  FieldDescriptor *local_90;
  undefined1 local_88 [72];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_40;
  ulong local_38;
  
  MVar38 = Message::GetMetadata(message);
  this_00 = MVar38.reflection;
  bVar3 = field->field_0x1;
  if ((((bVar3 & 8) != 0) &&
      ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
    bVar32 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar32) {
      pcVar30 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar32,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar30 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        puVar15 = InternalSerializeMessageSetItem(field,message,target,stream);
        return puVar15;
      }
      goto LAB_00270583;
    }
    InternalSerializeField();
switchD_00270853_caseD_9:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x522);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)local_d8,(char (*) [19])"Invalid descriptor");
LAB_00272e1c:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_d8)
    ;
  }
LAB_00270583:
  if ((field->type_ == '\v') && (bVar32 = FieldDescriptor::is_map_message_type(field), bVar32)) {
    this = Reflection::GetMapData(this_00,message,field);
    cVar8 = MapFieldBase::IsMapValid(this);
    if ((bool)cVar8) {
      local_38 = CONCAT71(local_38._1_7_,cVar8);
      if (stream->is_serialization_deterministic_ == true) {
        MapKeySorter::SortKey
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_d8,message,this_00,field);
        if (local_d8._0_8_ != local_d8._8_8_) {
          key._M_head_impl = (LogMessageData *)local_d8._0_8_;
          do {
            local_88._0_8_ = 0;
            local_88._8_4_ = 0;
            Reflection::LookupMapValue
                      (this_00,message,field,(MapKey *)key._M_head_impl,
                       (MapValueConstRef *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
            target = InternalSerializeMapEntry
                               (field,(MapKey *)key._M_head_impl,
                                (MapValueConstRef *)
                                &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                                target,stream);
            key._M_head_impl = (LogMessageData *)((long)&(key._M_head_impl)->entry + 0x18);
          } while (key._M_head_impl != (LogMessageData *)local_d8._8_8_);
        }
        if ((Descriptor *)local_d8._0_8_ != (Descriptor *)0x0) {
          operator_delete((void *)local_d8._0_8_,
                          CONCAT71(local_d8._17_7_,local_d8[0x10]) - local_d8._0_8_);
        }
      }
      else {
        Reflection::MapBegin((MapIterator *)local_d8,this_00,message,field);
        local_90 = (FieldDescriptor *)message;
        Reflection::MapEnd((MapIterator *)
                           &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,this_00,
                           message,field);
        bVar32 = MapFieldBase::EqualIterator
                           ((MapFieldBase *)local_d8._24_8_,(MapIterator *)local_d8,
                            (MapIterator *)
                            &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
        message = (Message *)local_90;
        while (!bVar32) {
          target = InternalSerializeMapEntry(field,&local_b8,&local_a0,target,stream);
          MapFieldBase::IncreaseIterator((MapFieldBase *)local_d8._24_8_,(MapIterator *)local_d8);
          Reflection::MapEnd((MapIterator *)
                             &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,this_00,
                             message,field);
          bVar32 = MapFieldBase::EqualIterator
                             ((MapFieldBase *)local_d8._24_8_,(MapIterator *)local_d8,
                              (MapIterator *)
                              &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
        }
      }
      cVar8 = (char)local_38;
    }
    if (cVar8 != '\0') {
      return target;
    }
  }
  bVar3 = field->field_0x1;
  bVar32 = (bool)((bVar3 & 0x20) >> 5);
  if (0xbf < bVar3 == bVar32) {
    pcVar30 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar32,0xbf < bVar3,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar30 != (Nonnull<const_char_*>)0x0) {
    InternalSerializeField();
    pcVar30 = extraout_RAX;
LAB_00272ec6:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,pcVar30);
    goto LAB_00272e1c;
  }
  if ((field->field_0x1 & 0x20) == 0) {
    uVar9 = 1;
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar32 = Reflection::HasField(this_00,message,field);
      uVar9 = (uint)bVar32;
    }
  }
  else {
    uVar9 = Reflection::FieldSize(this_00,message,field);
  }
  if (((int)uVar9 < 2) || (field->type_ != '\v')) {
LAB_002707f7:
    pLVar35 = (LogMessageData *)0x0;
    local_40._M_head_impl = (LogMessageData *)0x0;
    local_90 = (FieldDescriptor *)0x0;
  }
  else {
    local_90 = (FieldDescriptor *)0x0;
    bVar32 = FieldDescriptor::is_map_message_type(field);
    if ((!bVar32) || (stream->is_serialization_deterministic_ != true)) goto LAB_002707f7;
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_d8,message,uVar9,this_00,field);
    local_40._M_head_impl = (LogMessageData *)local_d8._8_8_;
    local_90 = (FieldDescriptor *)CONCAT71(local_d8._17_7_,local_d8[0x10]);
    pLVar35 = (LogMessageData *)local_d8._0_8_;
  }
  bVar32 = FieldDescriptor::is_packed(field);
  if (!bVar32) {
    if (0 < (int)uVar9) {
      local_38 = (ulong)uVar9;
      uVar34 = 0;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        iVar14 = (int)uVar34;
        switch(field->type_) {
        case '\x01':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              dVar37 = Reflection::GetDouble(this_00,message,field);
            }
            else {
              dVar37 = Reflection::GetRepeatedDouble(this_00,message,field,iVar14);
            }
            uVar29 = (ulong)(field->number_ * 8 + 1);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar9 = (uint)uVar29;
                *target = (byte)uVar29 | 0x80;
                uVar29 = uVar29 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            *target = (byte)uVar29;
            *(double *)(target + 1) = dVar37;
            goto LAB_00271231;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x02':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              fVar36 = Reflection::GetFloat(this_00,message,field);
            }
            else {
              fVar36 = Reflection::GetRepeatedFloat(this_00,message,field,iVar14);
            }
            uVar29 = (ulong)(field->number_ * 8 + 5);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar9 = (uint)uVar29;
                *target = (byte)uVar29 | 0x80;
                uVar29 = uVar29 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            *target = (byte)uVar29;
            *(float *)(target + 1) = fVar36;
            goto LAB_002712bd;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x03':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar21 = Reflection::GetInt64(this_00,message,field);
            }
            else {
              uVar21 = Reflection::GetRepeatedInt64(this_00,message,field,iVar14);
            }
            uVar13 = field->number_ << 3;
            uVar9 = uVar13;
            if (0x7f < uVar13) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar13 = uVar9 >> 7;
                target = target + 1;
                bVar32 = 0x3fff < uVar9;
                uVar9 = uVar13;
              } while (bVar32);
            }
            *target = (byte)uVar13;
            pbVar31 = target + 1;
            uVar29 = uVar21;
            if (0x7f < uVar21) {
              do {
                *pbVar31 = (byte)uVar29 | 0x80;
                uVar21 = uVar29 >> 7;
                pbVar31 = pbVar31 + 1;
                bVar32 = 0x3fff < uVar29;
                uVar29 = uVar21;
              } while (bVar32);
            }
            goto LAB_0027127a;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x04':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar21 = Reflection::GetUInt64(this_00,message,field);
            }
            else {
              uVar21 = Reflection::GetRepeatedUInt64(this_00,message,field,iVar14);
            }
            uVar13 = field->number_ << 3;
            uVar9 = uVar13;
            if (0x7f < uVar13) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar13 = uVar9 >> 7;
                target = target + 1;
                bVar32 = 0x3fff < uVar9;
                uVar9 = uVar13;
              } while (bVar32);
            }
            *target = (byte)uVar13;
            pbVar31 = target + 1;
            uVar29 = uVar21;
            if (0x7f < uVar21) {
              do {
                *pbVar31 = (byte)uVar29 | 0x80;
                uVar21 = uVar29 >> 7;
                pbVar31 = pbVar31 + 1;
                bVar32 = 0x3fff < uVar29;
                uVar29 = uVar21;
              } while (bVar32);
            }
            goto LAB_0027127a;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x05':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar9 = Reflection::GetInt32(this_00,message,field);
            }
            else {
              uVar9 = Reflection::GetRepeatedInt32(this_00,message,field,iVar14);
            }
            uVar33 = field->number_ << 3;
            uVar13 = uVar33;
            if (0x7f < uVar33) {
              do {
                *target = (byte)uVar13 | 0x80;
                uVar33 = uVar13 >> 7;
                target = target + 1;
                bVar32 = 0x3fff < uVar13;
                uVar13 = uVar33;
              } while (bVar32);
            }
            *target = (byte)uVar33;
            pbVar31 = target + 1;
            uVar21 = (ulong)(int)uVar9;
            uVar29 = uVar21;
            if (0x7f < uVar9) {
              do {
                *pbVar31 = (byte)uVar29 | 0x80;
                uVar21 = uVar29 >> 7;
                pbVar31 = pbVar31 + 1;
                bVar32 = 0x3fff < uVar29;
                uVar29 = uVar21;
              } while (bVar32);
            }
            *pbVar31 = (byte)uVar21;
            goto LAB_0027127e;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x06':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar16 = Reflection::GetUInt64(this_00,message,field);
            }
            else {
              uVar16 = Reflection::GetRepeatedUInt64(this_00,message,field,iVar14);
            }
            uVar9 = field->number_ * 8 + 1;
            uVar29 = (ulong)uVar9;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_00271226:
              uVar29 = (ulong)uVar9;
            }
            else {
              do {
                uVar9 = (uint)uVar29;
                *target = (byte)uVar29 | 0x80;
                uVar29 = uVar29 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            goto LAB_00271228;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\a':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar10 = Reflection::GetUInt32(this_00,message,field);
            }
            else {
              uVar10 = Reflection::GetRepeatedUInt32(this_00,message,field,iVar14);
            }
            uVar9 = field->number_ * 8 + 5;
            uVar29 = (ulong)uVar9;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_002712b2:
              uVar29 = (ulong)uVar9;
            }
            else {
              do {
                uVar9 = (uint)uVar29;
                *target = (byte)uVar29 | 0x80;
                uVar29 = uVar29 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            goto LAB_002712b4;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\b':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar30);
            goto LAB_00272e1c;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            bVar32 = Reflection::GetBool(this_00,message,field);
          }
          else {
            bVar32 = Reflection::GetRepeatedBool(this_00,message,field,iVar14);
          }
          uVar13 = field->number_ << 3;
          uVar9 = uVar13;
          if (0x7f < uVar13) {
            do {
              *target = (byte)uVar9 | 0x80;
              uVar13 = uVar9 >> 7;
              target = target + 1;
              bVar7 = 0x3fff < uVar9;
              uVar9 = uVar13;
            } while (bVar7);
          }
          *target = (byte)uVar13;
          target[1] = bVar32;
          target = target + 2;
          break;
        case '\t':
          FieldDescriptor::requires_utf8_validation(field);
          local_d8._0_8_ = local_d8 + 0x10;
          local_d8._8_8_ =
               (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )0x0;
          local_d8[0x10] = '\0';
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar30);
LAB_002730dd:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
          }
          if ((field->field_0x1 & 0x20) == 0) {
            psVar20 = Reflection::GetStringReference(this_00,message,field,(string *)local_d8);
          }
          else {
            psVar20 = Reflection::GetRepeatedStringReference
                                (this_00,message,field,iVar14,(string *)local_d8);
          }
          pcVar5 = (field->all_names_).payload_;
          uVar4 = *(ushort *)(pcVar5 + 2);
          field_name._M_len = pcVar5 + ~(ulong)uVar4;
          field_name._M_str = in_R9;
          WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)(psVar20->_M_dataplus)._M_p,
                     (char *)(ulong)(uint)psVar20->_M_string_length,1,(uint)uVar4,field_name);
          sVar6 = psVar20->_M_string_length;
          if ((long)sVar6 < 0x80) {
            uVar9 = field->number_ * 8;
            lVar17 = 1;
            if (((0x7f < uVar9) && (lVar17 = 2, 0x3fff < uVar9)) && (lVar17 = 3, 0x1fffff < uVar9))
            {
              lVar17 = 5 - (ulong)(uVar9 < 0x10000000);
            }
            if ((long)(stream->end_ + ~(ulong)(target + lVar17) + 0x10) < (long)sVar6)
            goto LAB_00271544;
            uVar33 = uVar9 | 2;
            uVar13 = uVar33;
            if (0x7f < uVar9) {
              do {
                *target = (byte)uVar13 | 0x80;
                uVar33 = uVar13 >> 7;
                target = target + 1;
                bVar32 = 0x3fff < uVar13;
                uVar13 = uVar33;
              } while (bVar32);
            }
            *target = (byte)uVar33;
            target[1] = (byte)sVar6;
            memcpy(target + 2,(psVar20->_M_dataplus)._M_p,sVar6);
            target = target + sVar6 + 2;
          }
          else {
LAB_00271544:
            s._M_str = (psVar20->_M_dataplus)._M_p;
            s._M_len = sVar6;
            target = io::EpsCopyOutputStream::WriteStringOutline(stream,field->number_,s,target);
          }
          if ((Descriptor *)local_d8._0_8_ != (Descriptor *)(local_d8 + 0x10)) {
LAB_002714a2:
            operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
          }
          break;
        case '\n':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar30);
            goto LAB_00272e1c;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            pMVar19 = &Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if (pLVar35 == local_40._M_head_impl) {
            pMVar19 = &Reflection::GetRepeatedMessage(this_00,message,field,iVar14)->
                       super_MessageLite;
          }
          else {
            pMVar19 = *(MessageLite **)((long)&pLVar35->entry + uVar34 * 8);
          }
          target = WireFormatLite::InternalWriteGroup(field->number_,pMVar19,target,stream);
          break;
        case '\v':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar30);
            goto LAB_00272e1c;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            pMVar19 = &Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if (pLVar35 == local_40._M_head_impl) {
            pMVar19 = &Reflection::GetRepeatedMessage(this_00,message,field,iVar14)->
                       super_MessageLite;
          }
          else {
            pMVar19 = *(MessageLite **)((long)&pLVar35->entry + uVar34 * 8);
          }
          iVar14 = field->number_;
          iVar12 = MessageLite::GetCachedSize(pMVar19);
          target = WireFormatLite::InternalWriteMessage(iVar14,pMVar19,iVar12,target,stream);
          break;
        case '\f':
          CVar11 = FieldDescriptor::cpp_string_type(field);
          if (CVar11 == kCord) {
            Reflection::GetCord((Reflection *)local_d8,(Message *)this_00,(FieldDescriptor *)message
                               );
            target = io::EpsCopyOutputStream::WriteString
                               (stream,field->number_,(Cord *)local_d8,target);
            absl::lts_20250127::Cord::~Cord((Cord *)local_d8);
          }
          else {
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._8_8_ =
                 (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )0x0;
            local_d8[0x10] = '\0';
            bVar3 = field->field_0x1;
            bVar32 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar32) {
              pcVar30 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar32,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar30 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)
                         &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar30);
              goto LAB_002730dd;
            }
            if ((field->field_0x1 & 0x20) == 0) {
              psVar20 = Reflection::GetStringReference(this_00,message,field,(string *)local_d8);
            }
            else {
              psVar20 = Reflection::GetRepeatedStringReference
                                  (this_00,message,field,iVar14,(string *)local_d8);
            }
            sVar6 = psVar20->_M_string_length;
            if ((long)sVar6 < 0x80) {
              uVar9 = field->number_ * 8;
              lVar17 = 1;
              if (((0x7f < uVar9) && (lVar17 = 2, 0x3fff < uVar9)) && (lVar17 = 3, 0x1fffff < uVar9)
                 ) {
                lVar17 = 5 - (ulong)(uVar9 < 0x10000000);
              }
              if ((long)(stream->end_ + ~(ulong)(target + lVar17) + 0x10) < (long)sVar6)
              goto LAB_00271973;
              uVar33 = uVar9 | 2;
              uVar13 = uVar33;
              if (0x7f < uVar9) {
                do {
                  *target = (byte)uVar13 | 0x80;
                  uVar33 = uVar13 >> 7;
                  target = target + 1;
                  bVar32 = 0x3fff < uVar13;
                  uVar13 = uVar33;
                } while (bVar32);
              }
              *target = (byte)uVar33;
              target[1] = (byte)sVar6;
              memcpy(target + 2,(psVar20->_M_dataplus)._M_p,sVar6);
              target = target + sVar6 + 2;
            }
            else {
LAB_00271973:
              s_00._M_str = (psVar20->_M_dataplus)._M_p;
              s_00._M_len = sVar6;
              target = io::EpsCopyOutputStream::WriteStringOutline
                                 (stream,field->number_,s_00,target);
            }
            if ((Descriptor *)local_d8._0_8_ != (Descriptor *)(local_d8 + 0x10)) goto LAB_002714a2;
          }
          break;
        case '\r':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar13 = Reflection::GetUInt32(this_00,message,field);
            }
            else {
              uVar13 = Reflection::GetRepeatedUInt32(this_00,message,field,iVar14);
            }
            uVar33 = field->number_ << 3;
            uVar9 = uVar33;
            if (0x7f < uVar33) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar33 = uVar9 >> 7;
                target = target + 1;
                bVar32 = 0x3fff < uVar9;
                uVar9 = uVar33;
              } while (bVar32);
            }
            *target = (byte)uVar33;
            pbVar31 = target + 1;
            uVar9 = uVar13;
            if (0x7f < uVar13) {
              do {
                *pbVar31 = (byte)uVar9 | 0x80;
                uVar13 = uVar9 >> 7;
                pbVar31 = pbVar31 + 1;
                bVar32 = 0x3fff < uVar9;
                uVar9 = uVar13;
              } while (bVar32);
            }
            goto LAB_00270fb2;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x0e':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              pEVar18 = Reflection::GetEnum(this_00,message,field);
            }
            else {
              pEVar18 = Reflection::GetRepeatedEnum(this_00,message,field,iVar14);
            }
            uVar9 = pEVar18->number_;
            uVar21 = (ulong)(int)uVar9;
            uVar33 = field->number_ << 3;
            uVar13 = uVar33;
            if (0x7f < uVar33) {
              do {
                *target = (byte)uVar13 | 0x80;
                uVar33 = uVar13 >> 7;
                target = target + 1;
                bVar32 = 0x3fff < uVar13;
                uVar13 = uVar33;
              } while (bVar32);
            }
            *target = (byte)uVar33;
            pbVar31 = target + 1;
            uVar29 = uVar21;
            if (0x7f < uVar9) {
              do {
                *pbVar31 = (byte)uVar29 | 0x80;
                uVar21 = uVar29 >> 7;
                pbVar31 = pbVar31 + 1;
                bVar32 = 0x3fff < uVar29;
                uVar29 = uVar21;
              } while (bVar32);
            }
            goto LAB_0027127a;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x0f':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar30);
            goto LAB_00272e1c;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            uVar10 = Reflection::GetInt32(this_00,message,field);
          }
          else {
            uVar10 = Reflection::GetRepeatedInt32(this_00,message,field,iVar14);
          }
          uVar9 = field->number_ * 8 + 5;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_002712b2;
          uVar29 = (ulong)uVar9;
          do {
            uVar9 = (uint)uVar29;
            *target = (byte)uVar29 | 0x80;
            uVar29 = uVar29 >> 7;
            target = target + 1;
          } while (0x3fff < uVar9);
LAB_002712b4:
          *target = (byte)uVar29;
          *(uint32_t *)(target + 1) = uVar10;
LAB_002712bd:
          target = target + 5;
          break;
        case '\x10':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar30);
            goto LAB_00272e1c;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            uVar16 = Reflection::GetInt64(this_00,message,field);
          }
          else {
            uVar16 = Reflection::GetRepeatedInt64(this_00,message,field,iVar14);
          }
          uVar9 = field->number_ * 8 + 1;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_00271226;
          uVar29 = (ulong)uVar9;
          do {
            uVar9 = (uint)uVar29;
            *target = (byte)uVar29 | 0x80;
            uVar29 = uVar29 >> 7;
            target = target + 1;
          } while (0x3fff < uVar9);
LAB_00271228:
          *target = (byte)uVar29;
          *(uint64_t *)(target + 1) = uVar16;
LAB_00271231:
          target = target + 9;
          break;
        case '\x11':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 == (Nonnull<const_char_*>)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              iVar14 = Reflection::GetInt32(this_00,message,field);
            }
            else {
              iVar14 = Reflection::GetRepeatedInt32(this_00,message,field,iVar14);
            }
            uVar13 = field->number_ << 3;
            uVar9 = uVar13;
            if (0x7f < uVar13) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar13 = uVar9 >> 7;
                target = target + 1;
                bVar32 = 0x3fff < uVar9;
                uVar9 = uVar13;
              } while (bVar32);
            }
            *target = (byte)uVar13;
            pbVar31 = target + 1;
            uVar13 = iVar14 >> 0x1f ^ iVar14 * 2;
            uVar9 = uVar13;
            if (0x7f < uVar13) {
              do {
                *pbVar31 = (byte)uVar9 | 0x80;
                uVar13 = uVar9 >> 7;
                pbVar31 = pbVar31 + 1;
                bVar32 = 0x3fff < uVar9;
                uVar9 = uVar13;
              } while (bVar32);
            }
LAB_00270fb2:
            *pbVar31 = (byte)uVar13;
            goto LAB_0027127e;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar30);
          goto LAB_00272e1c;
        case '\x12':
          bVar3 = field->field_0x1;
          bVar32 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar32) {
            pcVar30 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar32,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar30 != (Nonnull<const_char_*>)0x0) goto LAB_00272ec6;
          if ((field->field_0x1 & 0x20) == 0) {
            lVar17 = Reflection::GetInt64(this_00,message,field);
          }
          else {
            lVar17 = Reflection::GetRepeatedInt64(this_00,message,field,iVar14);
          }
          uVar13 = field->number_ << 3;
          uVar9 = uVar13;
          if (0x7f < uVar13) {
            do {
              *target = (byte)uVar9 | 0x80;
              uVar13 = uVar9 >> 7;
              target = target + 1;
              bVar32 = 0x3fff < uVar9;
              uVar9 = uVar13;
            } while (bVar32);
          }
          *target = (byte)uVar13;
          pbVar31 = target + 1;
          uVar21 = lVar17 >> 0x3f ^ lVar17 * 2;
          uVar29 = uVar21;
          if (0x7f < uVar21) {
            do {
              *pbVar31 = (byte)uVar29 | 0x80;
              uVar21 = uVar29 >> 7;
              pbVar31 = pbVar31 + 1;
              bVar32 = 0x3fff < uVar29;
              uVar29 = uVar21;
            } while (bVar32);
          }
LAB_0027127a:
          *pbVar31 = (byte)uVar21;
LAB_0027127e:
          target = pbVar31 + 1;
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != local_38);
    }
    goto LAB_002726ee;
  }
  if (uVar9 == 0) goto LAB_002726ee;
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  switch(field->type_) {
  case '\x01':
    rhs = Reflection::GetRepeatedFieldInternal<double>(this_00,message,field);
    RepeatedField<double>::RepeatedField
              ((RepeatedField<double> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,(Arena *)0x0,rhs);
    iVar14 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    if (target < stream->end_) {
      uVar9 = iVar12 << 3;
      uVar34 = (ulong)(iVar14 * 8 + 2);
      if (0x7f < (uint)(iVar14 << 3)) {
        do {
          uVar13 = (uint)uVar34;
          *target = (byte)uVar34 | 0x80;
          uVar34 = uVar34 >> 7;
          target = target + 1;
        } while (0x3fff < uVar13);
      }
      *target = (byte)uVar34;
      pbVar31 = target + 1;
      uVar13 = uVar9;
      uVar33 = uVar9;
      if (0x7f < uVar9) {
        do {
          target = pbVar31;
          *target = (byte)uVar33 | 0x80;
          uVar13 = uVar33 >> 7;
          pbVar31 = target + 1;
          bVar32 = 0x3fff < uVar33;
          uVar33 = uVar13;
        } while (bVar32);
      }
      *pbVar31 = (byte)uVar13;
      if ((local_88._0_8_ & 4) == 0) {
        piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
      }
      else {
        piVar27 = (int *)LongSooRep::elements
                                   (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
      }
      pbVar31 = target + 2;
      if ((long)stream->end_ - (long)pbVar31 < (long)(int)uVar9) {
        target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar27,uVar9,pbVar31);
      }
      else {
        memcpy(pbVar31,piVar27,(ulong)uVar9);
        target = pbVar31 + (int)uVar9;
      }
      RepeatedField<double>::~RepeatedField
                ((RepeatedField<double> *)
                 &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
      goto LAB_002726ee;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x355,"ptr < end_");
    goto LAB_00272e1c;
  case '\x02':
    rhs_00 = Reflection::GetRepeatedFieldInternal<float>(this_00,message,field);
    RepeatedField<float>::RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,(Arena *)0x0,rhs_00);
    iVar14 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar9 = iVar12 << 2;
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar13 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar13);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    uVar13 = uVar9;
    uVar33 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar31;
        *target = (byte)uVar33 | 0x80;
        uVar13 = uVar33 >> 7;
        pbVar31 = target + 1;
        bVar32 = 0x3fff < uVar33;
        uVar33 = uVar13;
      } while (bVar32);
    }
    *pbVar31 = (byte)uVar13;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    pbVar31 = target + 2;
    if ((long)stream->end_ - (long)pbVar31 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar27,uVar9,pbVar31);
    }
    else {
      memcpy(pbVar31,piVar27,(ulong)uVar9);
      target = pbVar31 + (int)uVar9;
    }
    RepeatedField<float>::~RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    goto LAB_002726ee;
  case '\x03':
    pRVar24 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep
               ,(Arena *)0x0,pRVar24);
    iVar14 = field->number_;
    sVar25 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar9 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    if (0x7f < (uint)sVar25) {
      do {
        target = pbVar31;
        uVar9 = (uint)sVar25;
        *target = (byte)sVar25 | 0x80;
        sVar25 = (size_t)(uVar9 >> 7);
        pbVar31 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar31 = (byte)sVar25;
    if ((local_88._0_8_ & 4) == 0) {
      paVar28 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->short_rep).field_1;
    }
    else {
      paVar28 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep)
      ;
    }
    iVar14 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    target = target + 2;
    paVar2 = paVar28 + iVar14;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar34 = *(ulong *)paVar28->data;
      uVar29 = uVar34;
      if (0x7f < uVar34) {
        do {
          *target = (byte)uVar29 | 0x80;
          uVar34 = uVar29 >> 7;
          target = target + 1;
          bVar32 = 0x3fff < uVar29;
          uVar29 = uVar34;
        } while (bVar32);
      }
      paVar28 = paVar28 + 1;
      *target = (byte)uVar34;
      target = target + 1;
    } while (paVar28 < paVar2);
    goto LAB_002721d0;
  case '\x04':
    pRVar26 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,(Arena *)0x0,pRVar26);
    iVar14 = field->number_;
    sVar25 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar9 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    if (0x7f < (uint)sVar25) {
      do {
        target = pbVar31;
        uVar9 = (uint)sVar25;
        *target = (byte)sVar25 | 0x80;
        sVar25 = (size_t)(uVar9 >> 7);
        pbVar31 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar31 = (byte)sVar25;
    if ((local_88._0_8_ & 4) == 0) {
      paVar28 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->short_rep).field_1;
    }
    else {
      paVar28 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep)
      ;
    }
    iVar14 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    target = target + 2;
    paVar2 = paVar28 + iVar14;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar34 = *(ulong *)paVar28->data;
      uVar29 = uVar34;
      if (0x7f < uVar34) {
        do {
          *target = (byte)uVar29 | 0x80;
          uVar34 = uVar29 >> 7;
          target = target + 1;
          bVar32 = 0x3fff < uVar29;
          uVar29 = uVar34;
        } while (bVar32);
      }
      paVar28 = paVar28 + 1;
      *target = (byte)uVar34;
      target = target + 1;
    } while (paVar28 < paVar2);
    goto LAB_0027251f;
  case '\x05':
    pRVar22 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
               (Arena *)0x0,pRVar22);
    iVar14 = field->number_;
    sVar25 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar9 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    if (0x7f < (uint)sVar25) {
      do {
        target = pbVar31;
        uVar9 = (uint)sVar25;
        *target = (byte)sVar25 | 0x80;
        sVar25 = (size_t)(uVar9 >> 7);
        pbVar31 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar31 = (byte)sVar25;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    iVar14 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar27 + iVar14;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar29 = (ulong)*piVar27;
      uVar34 = uVar29;
      if (0x7f < uVar29) {
        do {
          *target = (byte)uVar34 | 0x80;
          uVar29 = uVar34 >> 7;
          target = target + 1;
          bVar32 = 0x3fff < uVar34;
          uVar34 = uVar29;
        } while (bVar32);
      }
      piVar27 = piVar27 + 1;
      *target = (byte)uVar29;
      target = target + 1;
    } while (piVar27 < piVar1);
    break;
  case '\x06':
    pRVar26 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,(Arena *)0x0,pRVar26);
    iVar14 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar9 = iVar12 << 3;
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar13 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar13);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    uVar13 = uVar9;
    uVar33 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar31;
        *target = (byte)uVar33 | 0x80;
        uVar13 = uVar33 >> 7;
        pbVar31 = target + 1;
        bVar32 = 0x3fff < uVar33;
        uVar33 = uVar13;
      } while (bVar32);
    }
    *pbVar31 = (byte)uVar13;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    pbVar31 = target + 2;
    if ((long)stream->end_ - (long)pbVar31 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar27,uVar9,pbVar31);
    }
    else {
      memcpy(pbVar31,piVar27,(ulong)uVar9);
      target = pbVar31 + (int)uVar9;
    }
LAB_0027251f:
    RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    goto LAB_002726ee;
  case '\a':
    pRVar23 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,(Arena *)0x0,pRVar23);
    iVar14 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar9 = iVar12 << 2;
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar13 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar13);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    uVar13 = uVar9;
    uVar33 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar31;
        *target = (byte)uVar33 | 0x80;
        uVar13 = uVar33 >> 7;
        pbVar31 = target + 1;
        bVar32 = 0x3fff < uVar33;
        uVar33 = uVar13;
      } while (bVar32);
    }
    *pbVar31 = (byte)uVar13;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    pbVar31 = target + 2;
    if ((long)stream->end_ - (long)pbVar31 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar27,uVar9,pbVar31);
    }
    else {
      memcpy(pbVar31,piVar27,(ulong)uVar9);
      target = pbVar31 + (int)uVar9;
    }
    goto LAB_002726e1;
  case '\b':
    rhs_01 = Reflection::GetRepeatedFieldInternal<bool>(this_00,message,field);
    RepeatedField<bool>::RepeatedField
              ((RepeatedField<bool> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep
               ,(Arena *)0x0,rhs_01);
    iVar14 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                         (local_88._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar13 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar13);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    uVar13 = uVar9;
    uVar33 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar31;
        *target = (byte)uVar33 | 0x80;
        uVar13 = uVar33 >> 7;
        pbVar31 = target + 1;
        bVar32 = 0x3fff < uVar33;
        uVar33 = uVar13;
      } while (bVar32);
    }
    *pbVar31 = (byte)uVar13;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    pbVar31 = target + 2;
    if ((long)stream->end_ - (long)pbVar31 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar27,uVar9,pbVar31);
    }
    else {
      memcpy(pbVar31,piVar27,(ulong)uVar9);
      target = pbVar31 + (int)uVar9;
    }
    RepeatedField<bool>::~RepeatedField
              ((RepeatedField<bool> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep
              );
    goto LAB_002726ee;
  default:
    goto switchD_00270853_caseD_9;
  case '\r':
    pRVar23 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,(Arena *)0x0,pRVar23);
    iVar14 = field->number_;
    sVar25 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar9 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    if (0x7f < (uint)sVar25) {
      do {
        target = pbVar31;
        uVar9 = (uint)sVar25;
        *target = (byte)sVar25 | 0x80;
        sVar25 = (size_t)(uVar9 >> 7);
        pbVar31 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar31 = (byte)sVar25;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    iVar14 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar27 + iVar14;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar9 = *piVar27;
      uVar13 = uVar9;
      if (0x7f < uVar9) {
        do {
          *target = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          target = target + 1;
          bVar32 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar32);
      }
      piVar27 = piVar27 + 1;
      *target = (byte)uVar9;
      target = target + 1;
    } while (piVar27 < piVar1);
LAB_002726e1:
    RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    goto LAB_002726ee;
  case '\x0e':
    pRVar22 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
               (Arena *)0x0,pRVar22);
    iVar14 = field->number_;
    sVar25 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar9 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    if (0x7f < (uint)sVar25) {
      do {
        target = pbVar31;
        uVar9 = (uint)sVar25;
        *target = (byte)sVar25 | 0x80;
        sVar25 = (size_t)(uVar9 >> 7);
        pbVar31 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar31 = (byte)sVar25;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    iVar14 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar27 + iVar14;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar29 = (ulong)*piVar27;
      uVar34 = uVar29;
      if (0x7f < uVar29) {
        do {
          *target = (byte)uVar34 | 0x80;
          uVar29 = uVar34 >> 7;
          target = target + 1;
          bVar32 = 0x3fff < uVar34;
          uVar34 = uVar29;
        } while (bVar32);
      }
      piVar27 = piVar27 + 1;
      *target = (byte)uVar29;
      target = target + 1;
    } while (piVar27 < piVar1);
    break;
  case '\x0f':
    pRVar22 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
               (Arena *)0x0,pRVar22);
    iVar14 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar9 = iVar12 << 2;
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar13 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar13);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    uVar13 = uVar9;
    uVar33 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar31;
        *target = (byte)uVar33 | 0x80;
        uVar13 = uVar33 >> 7;
        pbVar31 = target + 1;
        bVar32 = 0x3fff < uVar33;
        uVar33 = uVar13;
      } while (bVar32);
    }
    *pbVar31 = (byte)uVar13;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    pbVar31 = target + 2;
    if ((long)stream->end_ - (long)pbVar31 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar27,uVar9,pbVar31);
    }
    else {
      memcpy(pbVar31,piVar27,(ulong)uVar9);
      target = pbVar31 + (int)uVar9;
    }
    break;
  case '\x10':
    pRVar24 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep
               ,(Arena *)0x0,pRVar24);
    iVar14 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar9 = iVar12 << 3;
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar13 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar13);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    uVar13 = uVar9;
    uVar33 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar31;
        *target = (byte)uVar33 | 0x80;
        uVar13 = uVar33 >> 7;
        pbVar31 = target + 1;
        bVar32 = 0x3fff < uVar33;
        uVar33 = uVar13;
      } while (bVar32);
    }
    *pbVar31 = (byte)uVar13;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    pbVar31 = target + 2;
    if ((long)stream->end_ - (long)pbVar31 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar27,uVar9,pbVar31);
    }
    else {
      memcpy(pbVar31,piVar27,(ulong)uVar9);
      target = pbVar31 + (int)uVar9;
    }
    goto LAB_002721d0;
  case '\x11':
    pRVar22 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
               (Arena *)0x0,pRVar22);
    iVar14 = field->number_;
    sVar25 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar9 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    if (0x7f < (uint)sVar25) {
      do {
        target = pbVar31;
        uVar9 = (uint)sVar25;
        *target = (byte)sVar25 | 0x80;
        sVar25 = (size_t)(uVar9 >> 7);
        pbVar31 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar31 = (byte)sVar25;
    if ((local_88._0_8_ & 4) == 0) {
      piVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep).size;
    }
    else {
      piVar27 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
    }
    iVar14 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar27 + iVar14;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar13 = *piVar27 >> 0x1f ^ *piVar27 * 2;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *target = (byte)uVar9 | 0x80;
          uVar13 = uVar9 >> 7;
          target = target + 1;
          bVar32 = 0x3fff < uVar9;
          uVar9 = uVar13;
        } while (bVar32);
      }
      piVar27 = piVar27 + 1;
      *target = (byte)uVar13;
      target = target + 1;
    } while (piVar27 < piVar1);
    break;
  case '\x12':
    pRVar24 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep
               ,(Arena *)0x0,pRVar24);
    iVar14 = field->number_;
    sVar25 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00272e1c;
    }
    uVar34 = (ulong)(iVar14 * 8 + 2);
    if (0x7f < (uint)(iVar14 << 3)) {
      do {
        uVar9 = (uint)uVar34;
        *target = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar34;
    pbVar31 = target + 1;
    if (0x7f < (uint)sVar25) {
      do {
        target = pbVar31;
        uVar9 = (uint)sVar25;
        *target = (byte)sVar25 | 0x80;
        sVar25 = (size_t)(uVar9 >> 7);
        pbVar31 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar31 = (byte)sVar25;
    if ((local_88._0_8_ & 4) == 0) {
      paVar28 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->short_rep).field_1;
    }
    else {
      paVar28 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep)
      ;
    }
    iVar14 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep,
                          (local_88._0_8_ & 4) == 0);
    target = target + 2;
    paVar2 = paVar28 + iVar14;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar29 = *(long *)paVar28->data >> 0x3f ^ *(long *)paVar28->data * 2;
      uVar34 = uVar29;
      if (0x7f < uVar29) {
        do {
          *target = (byte)uVar34 | 0x80;
          uVar29 = uVar34 >> 7;
          target = target + 1;
          bVar32 = 0x3fff < uVar34;
          uVar34 = uVar29;
        } while (bVar32);
      }
      paVar28 = paVar28 + 1;
      *target = (byte)uVar29;
      target = target + 1;
    } while (paVar28 < paVar2);
LAB_002721d0:
    RepeatedField<long>::~RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep
              );
    goto LAB_002726ee;
  }
  RepeatedField<int>::~RepeatedField
            ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_88)->long_rep);
LAB_002726ee:
  if (pLVar35 != (LogMessageData *)0x0) {
    operator_delete(pLVar35,(long)local_90 - (long)pLVar35);
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}